

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

SVectorBase<double> * __thiscall
soplex::SVectorBase<double>::operator*=(SVectorBase<double> *this,double *x)

{
  double *in_RSI;
  SVectorBase<double> *in_RDI;
  Nonzero<double> *e;
  int n;
  Nonzero<double> *local_20;
  int local_14;
  
  local_14 = size(in_RDI);
  local_20 = in_RDI->m_elem;
  while (local_14 != 0) {
    local_20->val = *in_RSI * local_20->val;
    local_20 = local_20 + 1;
    local_14 = local_14 + -1;
  }
  return in_RDI;
}

Assistant:

SVectorBase<R>& operator*=(const R& x)
   {
      int n = size();
      Nonzero<R>* e = m_elem;

      assert(x != 0);

      while(n--)
      {
         e->val *= x;
         e++;
      }

      return *this;
   }